

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O0

int nn_sinproc_recv(nn_pipebase *self,nn_msg *msg)

{
  int iVar1;
  nn_msgqueue *pnVar2;
  char *pcVar3;
  long in_RDI;
  nn_sinproc *sinproc;
  int rc;
  size_t in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar4;
  nn_fsm *in_stack_ffffffffffffffc8;
  FILE *__stream;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar5;
  nn_msgqueue *self_00;
  
  if (in_RDI == 0) {
    pnVar2 = (nn_msgqueue *)0x0;
  }
  else {
    pnVar2 = (nn_msgqueue *)(in_RDI + -0x68);
  }
  uVar5 = true;
  if (pnVar2[1].in.pos != 4) {
    uVar5 = pnVar2[1].in.pos == 5;
  }
  if (((uVar5 ^ 0xff) & 1) == 0) {
    self_00 = pnVar2;
    iVar1 = nn_msgqueue_recv((nn_msgqueue *)in_stack_ffffffffffffffc8,
                             (nn_msg *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)
                            );
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar3 = nn_err_strerror((int)(in_stack_ffffffffffffffb8 >> 0x20));
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
              ,0xbf);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((pnVar2[1].in.pos != 5) && ((*(uint *)&pnVar2[1].in.field_0xc & 2) != 0)) {
      iVar1 = nn_msgqueue_send(self_00,(nn_msg *)CONCAT17(uVar5,in_stack_ffffffffffffffd0));
      uVar4 = iVar1 == 0 || iVar1 == -0xb;
      if (iVar1 != 0 && iVar1 != -0xb) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0 || rc == -EAGAIN",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
                ,0xc6);
        fflush(_stderr);
        nn_err_abort();
      }
      if (iVar1 == 0) {
        nn_msg_init((nn_msg *)CONCAT17(uVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
        nn_fsm_raiseto((nn_fsm *)CONCAT17(uVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
                       ,(nn_fsm_event *)CONCAT17(uVar4,in_stack_ffffffffffffffc0),
                       (int)(in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8,
                       (void *)0x1664dd);
        *(uint *)&pnVar2[1].in.field_0xc = *(uint *)&pnVar2[1].in.field_0xc & 0xfffffffd;
      }
    }
    iVar1 = nn_msgqueue_empty(pnVar2 + 5);
    if (iVar1 == 0) {
      nn_pipebase_received((nn_pipebase *)0x166513);
    }
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
          "sinproc->state == NN_SINPROC_STATE_ACTIVE || sinproc->state == NN_SINPROC_STATE_DISCONNECTED"
          ,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
          ,0xbb);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_sinproc_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, pipebase);

    /*  Sanity check. */
    nn_assert (sinproc->state == NN_SINPROC_STATE_ACTIVE ||
        sinproc->state == NN_SINPROC_STATE_DISCONNECTED);

    /*  Move the message to the caller. */
    rc = nn_msgqueue_recv (&sinproc->msgqueue, msg);
    errnum_assert (rc == 0, -rc);

    /*  If there was a message from peer lingering because of the exceeded
        buffer limit, try to enqueue it once again. */
    if (sinproc->state != NN_SINPROC_STATE_DISCONNECTED) {
        if (nn_slow (sinproc->flags & NN_SINPROC_FLAG_RECEIVING)) {
            rc = nn_msgqueue_send (&sinproc->msgqueue, &sinproc->peer->msg);
            nn_assert (rc == 0 || rc == -EAGAIN);
            if (rc == 0) {
                errnum_assert (rc == 0, -rc);
                nn_msg_init (&sinproc->peer->msg, 0);
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->peer->event_received, NN_SINPROC_SRC_PEER,
                    NN_SINPROC_RECEIVED, sinproc);
                sinproc->flags &= ~NN_SINPROC_FLAG_RECEIVING;
            }
        }
    }

    if (!nn_msgqueue_empty (&sinproc->msgqueue))
       nn_pipebase_received (&sinproc->pipebase);

    return 0;
}